

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O2

void __thiscall
icu_63::StringTrieBuilder::BranchHeadNode::BranchHeadNode
          (BranchHeadNode *this,int32_t len,Node *subNode)

{
  int iVar1;
  
  if (subNode == (Node *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = subNode->hash;
  }
  (this->super_ValueNode).super_Node.hash = iVar1 + len * 0x25 + 0x23999776;
  (this->super_ValueNode).super_Node.offset = 0;
  (this->super_ValueNode).hasValue = '\0';
  (this->super_ValueNode).value = 0;
  (this->super_ValueNode).super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UObject_00476578;
  this->length = len;
  this->next = subNode;
  return;
}

Assistant:

static inline int32_t hashCode(const Node *node) { return node==NULL ? 0 : node->hashCode(); }